

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O0

void __thiscall merkle_tests::merkle_test_oneTx_block::test_method(merkle_test_oneTx_block *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CMutableTransaction mtx;
  bool mutated;
  uint256 root;
  CBlock block;
  CTransaction *in_stack_fffffffffffffdf8;
  CMutableTransaction *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  size_type in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  lazy_ostream *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  size_t line_num;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  CMutableTransaction *in_stack_fffffffffffffe38;
  bool *mutated_00;
  CBlock *in_stack_fffffffffffffe58;
  CMutableTransaction local_189;
  undefined1 local_138 [16];
  undefined1 local_128 [64];
  bool local_e8 [68];
  undefined4 local_a4;
  undefined1 local_99;
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_99 = 0;
  CBlock::CBlock((CBlock *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
           in_stack_fffffffffffffe10);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffdf8);
  local_a4 = 0;
  ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffffe00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
  mutated_00 = local_e8;
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe08,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffe00);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdf8);
  BlockMerkleRoot(in_stack_fffffffffffffe58,mutated_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe38,
               (const_string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,(const_string *)in_stack_fffffffffffffe20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe00 =
         (CMutableTransaction *)CTransaction::GetHash(in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe08 = "block.vtx[0]->GetHash()";
    in_stack_fffffffffffffdf8 = (CTransaction *)0x1d1f4a0;
    in_stack_fffffffffffffe38 = in_stack_fffffffffffffe00;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,transaction_identifier<false>>
              (local_128,local_138,0x111,1,2,local_98);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe37 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe37);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe38,
               (const_string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               line_num,(const_string *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,(char (*) [1])in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe08,
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    local_189.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = 0;
    in_stack_fffffffffffffe08 = "false";
    in_stack_fffffffffffffe00 = &local_189;
    in_stack_fffffffffffffdf8 = (CTransaction *)0x1bbff6e;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              ((undefined1 *)
               ((long)&local_189.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1),
               (undefined1 *)
               ((long)&local_189.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start + 1),0x112,1,2,&local_99);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffdf8);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_oneTx_block)
{
    bool mutated = false;
    CBlock block;

    block.vtx.resize(1);
    CMutableTransaction mtx;
    mtx.nLockTime = 0;
    block.vtx[0] = MakeTransactionRef(std::move(mtx));
    uint256 root = BlockMerkleRoot(block, &mutated);
    BOOST_CHECK_EQUAL(root, block.vtx[0]->GetHash());
    BOOST_CHECK_EQUAL(mutated, false);
}